

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionResultData::~AssertionResultData(AssertionResultData *this)

{
  std::__cxx11::string::~string((string *)&this->reconstructedExpression);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionResultData() = delete;